

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O0

int Abc_NtkTestScorrWriteEquivAig(Tst_Dat_t *pData)

{
  Abc_Ntk_t *pNetlist_00;
  Vec_Int_t *vId2Name_00;
  Aig_Man_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pAVar5;
  uint local_50;
  int local_4c;
  int Counter;
  int i;
  Aig_Obj_t *pRepr;
  Aig_Obj_t *pObj;
  FILE *pFile;
  char *pFileNameOut;
  Aig_Man_t *pAig;
  Vec_Int_t *vId2Name;
  Abc_Ntk_t *pNetlist;
  Tst_Dat_t *pData_local;
  
  pNetlist_00 = pData->pNetlist;
  vId2Name_00 = pData->vId2Name;
  p = pData->pAig;
  pFile = (FILE *)pData->pFileNameOut;
  local_50 = 0;
  if (pData->fDumpBmc != 0) {
    pData->fDumpBmc = 0;
    pFile = (FILE *)Abc_NtkBmcFileName((char *)pFile);
  }
  __stream = fopen((char *)pFile,"wb");
  local_4c = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_4c) {
      fclose(__stream);
      printf("%d pairs of sequentially equivalent nodes are written into file \"%s\".\n",
             (ulong)local_50,pFile);
      return local_50;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_4c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) &&
       (pObj_01 = Aig_ObjRepr(p,pObj_00), pObj_01 != (Aig_Obj_t *)0x0)) {
      if (pData->fFlopOnly == 0) {
        if (((pData->fFfNdOnly != 0) && (iVar1 = Saig_ObjIsLo(p,pObj_00), iVar1 == 0)) &&
           (iVar1 = Saig_ObjIsLo(p,pObj_01), iVar1 == 0)) {
          pAVar5 = Aig_ManConst1(p);
joined_r0x0037c9cb:
          if (pObj_01 != pAVar5) goto LAB_0037cad9;
        }
      }
      else {
        iVar1 = Saig_ObjIsLo(p,pObj_00);
        if (iVar1 == 0) goto LAB_0037cad9;
        iVar1 = Saig_ObjIsLo(p,pObj_01);
        if (iVar1 == 0) {
          pAVar5 = Aig_ManConst1(p);
          goto joined_r0x0037c9cb;
        }
      }
      pAVar5 = Aig_ManConst1(p);
      if (pObj_01 == pAVar5) {
        iVar1 = Aig_ObjId(pObj_00);
        iVar2 = Aig_ObjPhase(pObj_00);
        iVar1 = Abc_NtkTestScorrWriteEquivConst
                          (pNetlist_00,vId2Name_00,iVar1,(FILE *)__stream,iVar2);
      }
      else {
        iVar1 = Aig_ObjId(pObj_01);
        iVar2 = Aig_ObjId(pObj_00);
        uVar3 = Aig_ObjPhase(pObj_01);
        uVar4 = Aig_ObjPhase(pObj_00);
        iVar1 = Abc_NtkTestScorrWriteEquivPair
                          (pNetlist_00,vId2Name_00,iVar1,iVar2,(FILE *)__stream,uVar3 ^ uVar4);
      }
      local_50 = iVar1 + local_50;
    }
LAB_0037cad9:
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int Abc_NtkTestScorrWriteEquivAig( Tst_Dat_t * pData )
{
    Abc_Ntk_t * pNetlist = pData->pNetlist;
    Vec_Int_t * vId2Name = pData->vId2Name;
    Aig_Man_t * pAig     = pData->pAig;
    char * pFileNameOut  = pData->pFileNameOut;
    FILE * pFile;
    Aig_Obj_t * pObj, * pRepr;
    int i, Counter = 0;
    if ( pData->fDumpBmc )
    {
        pData->fDumpBmc = 0;
        pFileNameOut = Abc_NtkBmcFileName( pFileNameOut );
    }
    pFile = fopen( pFileNameOut, "wb" );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) == NULL )
            continue;
        if ( pData->fFlopOnly )
        {
            if ( !Saig_ObjIsLo(pAig, pObj) || !(Saig_ObjIsLo(pAig, pRepr)||pRepr==Aig_ManConst1(pAig)) )
                continue;
        }
        else if ( pData->fFfNdOnly )
        {
            if ( !Saig_ObjIsLo(pAig, pObj) && !(Saig_ObjIsLo(pAig, pRepr)||pRepr==Aig_ManConst1(pAig)) )
                continue;
        }
        if ( pRepr == Aig_ManConst1(pAig) )
            Counter += Abc_NtkTestScorrWriteEquivConst( pNetlist, vId2Name, Aig_ObjId(pObj), pFile, Aig_ObjPhase(pObj) );
        else
            Counter += Abc_NtkTestScorrWriteEquivPair( pNetlist, vId2Name, Aig_ObjId(pRepr), Aig_ObjId(pObj), pFile, 
                Aig_ObjPhase(pRepr) ^ Aig_ObjPhase(pObj) );
    }
    fclose( pFile );
    printf( "%d pairs of sequentially equivalent nodes are written into file \"%s\".\n", Counter, pFileNameOut );
    return Counter;
}